

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
* vkt::memory::anon_unknown_0::createCmdCommand
            (MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
             *__return_storage_ptr__,Random *rng,State *state,Op op,Usage usage)

{
  Type TVar1;
  VkAccessFlags VVar2;
  bool bVar3;
  VkPipelineStageFlags VVar4;
  VkAccessFlags VVar5;
  deUint32 dVar6;
  Type TVar7;
  FillBuffer *this;
  UpdateBuffer *this_00;
  BufferCopyToBuffer *this_01;
  BufferCopyFromBuffer *this_02;
  BufferCopyToImage *this_03;
  BufferCopyFromImage *this_04;
  ImageTransition *this_05;
  ImageCopyToBuffer *this_06;
  ImageCopyFromBuffer *this_07;
  ImageCopyToImage *this_08;
  ImageCopyFromImage *this_09;
  ImageBlitToImage *this_10;
  ImageBlitFromImage *this_11;
  PipelineBarrier *pPVar8;
  float fVar9;
  Type local_1b0;
  VkPipelineStageFlags local_1ac;
  uint local_148;
  VkImageLayout local_13c;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> local_cb;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> local_ca;
  undefined1 local_c9;
  Maybe<vk::VkImageLayout> local_c8;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> local_b2;
  undefined1 local_b1;
  Maybe<vk::VkImageLayout> local_b0;
  Type local_a0;
  VkAccessFlags local_9c;
  Type type;
  VkAccessFlags dstAccesses_1;
  VkPipelineStageFlags dstStages_1;
  VkAccessFlags srcAccesses_1;
  VkPipelineStageFlags srcStages_1;
  VkAccessFlags dirtyDstAccesses_1;
  VkPipelineStageFlags dirtyDstStages_1;
  VkAccessFlags dirtySrcAccesses_1;
  VkPipelineStageFlags dirtySrcStages_1;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> local_71;
  BlitScale scale_1;
  DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> local_69;
  BlitScale scale;
  uint local_64;
  uint local_60;
  VkAccessFlags dstAccesses;
  VkPipelineStageFlags dstStages;
  VkAccessFlags srcAccesses;
  VkPipelineStageFlags srcStages;
  VkAccessFlags dirtyDstAccesses;
  VkPipelineStageFlags dirtyDstStages;
  VkAccessFlags dirtySrcAccesses;
  VkPipelineStageFlags dirtySrcStages;
  VkImageLayout dstLayout;
  VkImageLayout srcLayout;
  Usage local_28;
  Op local_24;
  Usage usage_local;
  Op op_local;
  State *state_local;
  Random *rng_local;
  
  local_28 = usage;
  local_24 = op;
  _usage_local = state;
  state_local = (State *)rng;
  rng_local = (Random *)__return_storage_ptr__;
  switch(op) {
  case OP_BUFFER_FILL:
    this = (FillBuffer *)operator_new(0x18);
    dVar6 = de::Random::getUint32((Random *)state_local);
    FillBuffer::FillBuffer(this,dVar6);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&srcLayout + 3));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this);
    break;
  case OP_BUFFER_UPDATE:
    this_00 = (UpdateBuffer *)operator_new(0x18);
    dVar6 = de::Random::getUint32((Random *)state_local);
    UpdateBuffer::UpdateBuffer(this_00,dVar6);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&srcLayout + 2));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_00);
    break;
  case OP_BUFFER_COPY_TO_BUFFER:
    this_01 = (BufferCopyToBuffer *)operator_new(0x50);
    BufferCopyToBuffer::BufferCopyToBuffer(this_01);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&srcLayout + 1));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_01);
    break;
  case OP_BUFFER_COPY_FROM_BUFFER:
    this_02 = (BufferCopyFromBuffer *)operator_new(0x58);
    dVar6 = de::Random::getUint32((Random *)state_local);
    BufferCopyFromBuffer::BufferCopyFromBuffer(this_02,dVar6);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)&srcLayout);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_02);
    break;
  case OP_BUFFER_COPY_TO_IMAGE:
    this_03 = (BufferCopyToImage *)operator_new(0x50);
    BufferCopyToImage::BufferCopyToImage(this_03);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&dstLayout + 3));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_03);
    break;
  case OP_BUFFER_COPY_FROM_IMAGE:
    this_04 = (BufferCopyFromImage *)operator_new(0x58);
    dVar6 = de::Random::getUint32((Random *)state_local);
    BufferCopyFromImage::BufferCopyFromImage(this_04,dVar6);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&dstLayout + 2));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_04);
    break;
  default:
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter(&local_cb);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,0);
    break;
  case OP_IMAGE_TRANSITION_LAYOUT:
    fVar9 = de::Random::getFloat(rng);
    if (0.9 <= fVar9) {
      local_13c = VK_IMAGE_LAYOUT_UNDEFINED;
    }
    else {
      local_13c = _usage_local->imageLayout;
    }
    dirtySrcStages = local_13c;
    dirtySrcAccesses = getRandomNextLayout((Random *)state_local,local_28,local_13c);
    CacheState::getFullBarrier
              (&_usage_local->cache,&dirtyDstStages,&dirtyDstAccesses,&srcStages,&srcAccesses);
    dstStages = dirtyDstStages;
    dstAccesses = dirtyDstAccesses;
    VVar4 = CacheState::getAllowedStages(&_usage_local->cache);
    dVar6 = de::Random::getUint32((Random *)state_local);
    local_60 = VVar4 & dVar6;
    VVar5 = CacheState::getAllowedAcceses(&_usage_local->cache);
    dVar6 = de::Random::getUint32((Random *)state_local);
    local_64 = VVar5 & dVar6;
    if (local_60 == 0) {
      local_148 = CacheState::getAllowedStages(&_usage_local->cache);
    }
    else {
      local_148 = local_60;
    }
    local_60 = local_148;
    if (dstStages == 0) {
      dstStages = local_148;
    }
    this_05 = (ImageTransition *)operator_new(0x28);
    ImageTransition::ImageTransition
              (this_05,dstStages,dstAccesses,local_60,local_64,dirtySrcStages,dirtySrcAccesses);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)((long)&scale + 3))
    ;
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_05);
    break;
  case OP_IMAGE_COPY_TO_BUFFER:
    this_06 = (ImageCopyToBuffer *)operator_new(0x68);
    ImageCopyToBuffer::ImageCopyToBuffer(this_06,_usage_local->imageLayout);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)((long)&scale + 2))
    ;
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_06);
    break;
  case OP_IMAGE_COPY_FROM_BUFFER:
    this_07 = (ImageCopyFromBuffer *)operator_new(0x68);
    dVar6 = de::Random::getUint32((Random *)state_local);
    ImageCopyFromBuffer::ImageCopyFromBuffer(this_07,dVar6,_usage_local->imageLayout);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)((long)&scale + 1))
    ;
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_07);
    break;
  case OP_IMAGE_COPY_TO_IMAGE:
    this_08 = (ImageCopyToImage *)operator_new(0x60);
    ImageCopyToImage::ImageCopyToImage(this_08,_usage_local->imageLayout);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)&scale);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_08);
    break;
  case OP_IMAGE_COPY_FROM_IMAGE:
    this_09 = (ImageCopyFromImage *)operator_new(0x60);
    dVar6 = de::Random::getUint32((Random *)state_local);
    ImageCopyFromImage::ImageCopyFromImage(this_09,dVar6,_usage_local->imageLayout);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter(&local_69);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_09);
    break;
  case OP_IMAGE_BLIT_TO_IMAGE:
    bVar3 = de::Random::getBool(rng);
    scale_1 = (BlitScale)!bVar3;
    this_10 = (ImageBlitToImage *)operator_new(0x68);
    ImageBlitToImage::ImageBlitToImage(this_10,scale_1,_usage_local->imageLayout);
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter(&local_71);
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_10);
    break;
  case OP_IMAGE_BLIT_FROM_IMAGE:
    bVar3 = de::Random::getBool(rng);
    dirtySrcStages_1 = (VkPipelineStageFlags)!bVar3;
    this_11 = (ImageBlitFromImage *)operator_new(0x70);
    dVar6 = de::Random::getUint32((Random *)state_local);
    ImageBlitFromImage::ImageBlitFromImage(this_11,dVar6,dirtySrcStages_1,_usage_local->imageLayout)
    ;
    de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter
              ((DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand> *)
               ((long)&dirtySrcAccesses_1 + 3));
    de::details::
    MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
    ::MovePtr(__return_storage_ptr__,this_11);
    break;
  case OP_PIPELINE_BARRIER_GLOBAL:
  case OP_PIPELINE_BARRIER_BUFFER:
  case OP_PIPELINE_BARRIER_IMAGE:
    CacheState::getFullBarrier
              (&state->cache,&dirtyDstStages_1,&dirtyDstAccesses_1,&srcStages_1,&srcAccesses_1);
    VVar4 = dirtyDstStages_1;
    dVar6 = de::Random::getUint32((Random *)state_local);
    dstStages_1 = VVar4 & dVar6;
    dVar6 = de::Random::getUint32((Random *)state_local);
    VVar4 = srcStages_1;
    dstAccesses_1 = dirtyDstAccesses_1 & dVar6;
    TVar7 = de::Random::getUint32((Random *)state_local);
    type = VVar4 & TVar7;
    dVar6 = de::Random::getUint32((Random *)state_local);
    local_9c = srcAccesses_1 & dVar6;
    if (dstStages_1 == 0) {
      local_1ac = dirtyDstStages_1;
    }
    else {
      local_1ac = dstStages_1;
    }
    dstStages_1 = local_1ac;
    if (type == TYPE_GLOBAL) {
      local_1b0 = srcStages_1;
    }
    else {
      local_1b0 = type;
    }
    type = local_1b0;
    if (local_1ac == 0) {
      dstStages_1 = local_1b0;
    }
    if (local_24 == OP_PIPELINE_BARRIER_IMAGE) {
      local_a0 = TYPE_IMAGE;
    }
    else if (local_24 == OP_PIPELINE_BARRIER_BUFFER) {
      local_a0 = TYPE_BUFFER;
    }
    else if (local_24 == OP_PIPELINE_BARRIER_GLOBAL) {
      local_a0 = TYPE_GLOBAL;
    }
    else {
      local_a0 = TYPE_LAST;
    }
    if (local_a0 == TYPE_IMAGE) {
      pPVar8 = (PipelineBarrier *)operator_new(0x30);
      VVar4 = dstStages_1;
      VVar2 = dstAccesses_1;
      TVar1 = type;
      VVar5 = local_9c;
      TVar7 = local_a0;
      local_b1 = 1;
      tcu::just<vk::VkImageLayout>((tcu *)&local_b0,&_usage_local->imageLayout);
      PipelineBarrier::PipelineBarrier(pPVar8,VVar4,VVar2,TVar1,VVar5,TVar7,&local_b0);
      local_b1 = 0;
      de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter(&local_b2);
      de::details::
      MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
      ::MovePtr(__return_storage_ptr__,pPVar8);
      tcu::Maybe<vk::VkImageLayout>::~Maybe(&local_b0);
    }
    else {
      pPVar8 = (PipelineBarrier *)operator_new(0x30);
      VVar4 = dstStages_1;
      VVar2 = dstAccesses_1;
      TVar1 = type;
      VVar5 = local_9c;
      TVar7 = local_a0;
      local_c9 = 1;
      tcu::nothing<vk::VkImageLayout>();
      PipelineBarrier::PipelineBarrier(pPVar8,VVar4,VVar2,TVar1,VVar5,TVar7,&local_c8);
      local_c9 = 0;
      de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>::DefaultDeleter(&local_ca);
      de::details::
      MovePtr<vkt::memory::(anonymous_namespace)::CmdCommand,_de::DefaultDeleter<vkt::memory::(anonymous_namespace)::CmdCommand>_>
      ::MovePtr(__return_storage_ptr__,pPVar8);
      tcu::Maybe<vk::VkImageLayout>::~Maybe(&local_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

de::MovePtr<CmdCommand> createCmdCommand (de::Random&	rng,
										  const State&	state,
										  Op			op,
										  Usage			usage)
{
	switch (op)
	{
		case OP_BUFFER_FILL:					return de::MovePtr<CmdCommand>(new FillBuffer(rng.getUint32()));
		case OP_BUFFER_UPDATE:					return de::MovePtr<CmdCommand>(new UpdateBuffer(rng.getUint32()));
		case OP_BUFFER_COPY_TO_BUFFER:			return de::MovePtr<CmdCommand>(new BufferCopyToBuffer());
		case OP_BUFFER_COPY_FROM_BUFFER:		return de::MovePtr<CmdCommand>(new BufferCopyFromBuffer(rng.getUint32()));

		case OP_BUFFER_COPY_TO_IMAGE:			return de::MovePtr<CmdCommand>(new BufferCopyToImage());
		case OP_BUFFER_COPY_FROM_IMAGE:			return de::MovePtr<CmdCommand>(new BufferCopyFromImage(rng.getUint32()));

		case OP_IMAGE_TRANSITION_LAYOUT:
		{
			DE_ASSERT(state.stage == STAGE_COMMAND_BUFFER);
			DE_ASSERT(state.hasImage);
			DE_ASSERT(state.hasBoundImageMemory);

			const vk::VkImageLayout		srcLayout	= rng.getFloat() < 0.9f ? state.imageLayout : vk::VK_IMAGE_LAYOUT_UNDEFINED;
			const vk::VkImageLayout		dstLayout	= getRandomNextLayout(rng, usage, srcLayout);

			vk::VkPipelineStageFlags	dirtySrcStages;
			vk::VkAccessFlags			dirtySrcAccesses;
			vk::VkPipelineStageFlags	dirtyDstStages;
			vk::VkAccessFlags			dirtyDstAccesses;

			vk::VkPipelineStageFlags	srcStages;
			vk::VkAccessFlags			srcAccesses;
			vk::VkPipelineStageFlags	dstStages;
			vk::VkAccessFlags			dstAccesses;

			state.cache.getFullBarrier(dirtySrcStages, dirtySrcAccesses, dirtyDstStages, dirtyDstAccesses);

			// Try masking some random bits
			srcStages	= dirtySrcStages;
			srcAccesses	= dirtySrcAccesses;

			dstStages	= state.cache.getAllowedStages() & rng.getUint32();
			dstAccesses	= state.cache.getAllowedAcceses() & rng.getUint32();

			// If there are no bits in dst stage mask use all stages
			dstStages	= dstStages ? dstStages : state.cache.getAllowedStages();

			if (!srcStages)
				srcStages = dstStages;

			return de::MovePtr<CmdCommand>(new ImageTransition(srcStages, srcAccesses, dstStages, dstAccesses, srcLayout, dstLayout));
		}

		case OP_IMAGE_COPY_TO_BUFFER:			return de::MovePtr<CmdCommand>(new ImageCopyToBuffer(state.imageLayout));
		case OP_IMAGE_COPY_FROM_BUFFER:			return de::MovePtr<CmdCommand>(new ImageCopyFromBuffer(rng.getUint32(), state.imageLayout));
		case OP_IMAGE_COPY_TO_IMAGE:			return de::MovePtr<CmdCommand>(new ImageCopyToImage(state.imageLayout));
		case OP_IMAGE_COPY_FROM_IMAGE:			return de::MovePtr<CmdCommand>(new ImageCopyFromImage(rng.getUint32(), state.imageLayout));
		case OP_IMAGE_BLIT_TO_IMAGE:
		{
			const BlitScale scale = rng.getBool() ? BLIT_SCALE_20 : BLIT_SCALE_10;
			return de::MovePtr<CmdCommand>(new ImageBlitToImage(scale, state.imageLayout));
		}

		case OP_IMAGE_BLIT_FROM_IMAGE:
		{
			const BlitScale scale = rng.getBool() ? BLIT_SCALE_20 : BLIT_SCALE_10;
			return de::MovePtr<CmdCommand>(new ImageBlitFromImage(rng.getUint32(), scale, state.imageLayout));
		}

		case OP_PIPELINE_BARRIER_GLOBAL:
		case OP_PIPELINE_BARRIER_BUFFER:
		case OP_PIPELINE_BARRIER_IMAGE:
		{
			vk::VkPipelineStageFlags	dirtySrcStages;
			vk::VkAccessFlags			dirtySrcAccesses;
			vk::VkPipelineStageFlags	dirtyDstStages;
			vk::VkAccessFlags			dirtyDstAccesses;

			vk::VkPipelineStageFlags	srcStages;
			vk::VkAccessFlags			srcAccesses;
			vk::VkPipelineStageFlags	dstStages;
			vk::VkAccessFlags			dstAccesses;

			state.cache.getFullBarrier(dirtySrcStages, dirtySrcAccesses, dirtyDstStages, dirtyDstAccesses);

			// Try masking some random bits
			srcStages	= dirtySrcStages & rng.getUint32();
			srcAccesses	= dirtySrcAccesses & rng.getUint32();

			dstStages	= dirtyDstStages & rng.getUint32();
			dstAccesses	= dirtyDstAccesses & rng.getUint32();

			// If there are no bits in stage mask use the original dirty stages
			srcStages	= srcStages ? srcStages : dirtySrcStages;
			dstStages	= dstStages ? dstStages : dirtyDstStages;

			if (!srcStages)
				srcStages = dstStages;

			PipelineBarrier::Type type;

			if (op == OP_PIPELINE_BARRIER_IMAGE)
				type = PipelineBarrier::TYPE_IMAGE;
			else if (op == OP_PIPELINE_BARRIER_BUFFER)
				type = PipelineBarrier::TYPE_BUFFER;
			else if (op == OP_PIPELINE_BARRIER_GLOBAL)
				type = PipelineBarrier::TYPE_GLOBAL;
			else
			{
				type = PipelineBarrier::TYPE_LAST;
				DE_FATAL("Unknown op");
			}

			if (type == PipelineBarrier::TYPE_IMAGE)
				return de::MovePtr<CmdCommand>(new PipelineBarrier(srcStages, srcAccesses, dstStages, dstAccesses, type, tcu::just(state.imageLayout)));
			else
				return de::MovePtr<CmdCommand>(new PipelineBarrier(srcStages, srcAccesses, dstStages, dstAccesses, type, tcu::nothing<vk::VkImageLayout>()));
		}

		default:
			DE_FATAL("Unknown op");
			return de::MovePtr<CmdCommand>(DE_NULL);
	}
}